

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O2

psa_status_t psa_get_key_attributes(psa_key_handle_t handle,psa_key_attributes_t *attributes)

{
  psa_key_attributes_flag_t *ppVar1;
  psa_key_type_t pVar2;
  mbedtls_rsa_context *ctx;
  undefined8 uVar3;
  psa_algorithm_t pVar4;
  psa_key_bits_t pVar5;
  psa_key_lifetime_t pVar6;
  psa_key_id_t pVar7;
  psa_key_usage_t pVar8;
  psa_status_t pVar9;
  int ret;
  int iVar10;
  size_t __size;
  uchar *buf;
  psa_key_slot_t *slot;
  mbedtls_mpi local_40;
  
  psa_reset_key_attributes(attributes);
  pVar9 = psa_get_key_from_slot(handle,&slot,0,0);
  if (pVar9 != 0) {
    return pVar9;
  }
  pVar2 = (slot->attr).type;
  pVar5 = (slot->attr).bits;
  pVar6 = (slot->attr).lifetime;
  pVar7 = (slot->attr).id;
  pVar8 = (slot->attr).policy.usage;
  pVar4 = (slot->attr).policy.alg;
  uVar3 = *(undefined8 *)&(slot->attr).policy.alg2;
  (attributes->core).policy.usage = (slot->attr).policy.usage;
  (attributes->core).policy.alg = pVar4;
  *(undefined8 *)&(attributes->core).policy.alg2 = uVar3;
  (attributes->core).type = pVar2;
  (attributes->core).bits = pVar5;
  (attributes->core).lifetime = pVar6;
  (attributes->core).id = pVar7;
  (attributes->core).policy.usage = pVar8;
  ppVar1 = &(attributes->core).flags;
  *ppVar1 = *ppVar1 & 1;
  pVar2 = (slot->attr).type;
  if ((pVar2 != 0x7001) && (pVar2 != 0x4001)) {
    return 0;
  }
  ctx = (slot->data).rsa;
  mbedtls_mpi_init(&local_40);
  ret = mbedtls_rsa_export(ctx,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                           (mbedtls_mpi *)0x0,&local_40);
  if (ret == 0) {
    iVar10 = mbedtls_mpi_cmp_int(&local_40,0x10001);
    ret = 0;
    if (iVar10 != 0) {
      __size = mbedtls_mpi_size(&local_40);
      buf = (uchar *)calloc(1,__size);
      if (buf != (uchar *)0x0) {
        ret = mbedtls_mpi_write_binary(&local_40,buf,__size);
        if (ret == 0) {
          attributes->domain_parameters = buf;
          attributes->domain_parameters_size = __size;
          ret = 0;
        }
        goto LAB_00110d6c;
      }
      ret = -0x10;
    }
    buf = (uchar *)0x0;
  }
  else {
    buf = (uchar *)0x0;
  }
LAB_00110d6c:
  mbedtls_mpi_free(&local_40);
  if (ret != 0) {
    free(buf);
  }
  pVar9 = mbedtls_to_psa_error(ret);
  if (pVar9 == 0) {
    pVar9 = 0;
  }
  else {
    psa_reset_key_attributes(attributes);
  }
  return pVar9;
}

Assistant:

psa_status_t psa_get_key_attributes( psa_key_handle_t handle,
                                     psa_key_attributes_t *attributes )
{
    psa_key_slot_t *slot;
    psa_status_t status;

    psa_reset_key_attributes( attributes );

    status = psa_get_key_from_slot( handle, &slot, 0, 0 );
    if( status != PSA_SUCCESS )
        return( status );

    attributes->core = slot->attr;
    attributes->core.flags &= ( MBEDTLS_PSA_KA_MASK_EXTERNAL_ONLY |
                                MBEDTLS_PSA_KA_MASK_DUAL_USE );

#if defined(MBEDTLS_PSA_CRYPTO_SE_C)
    if( psa_key_slot_is_external( slot ) )
        psa_set_key_slot_number( attributes, slot->data.se.slot_number );
#endif /* MBEDTLS_PSA_CRYPTO_SE_C */

    switch( slot->attr.type )
    {
#if defined(MBEDTLS_RSA_C)
        case PSA_KEY_TYPE_RSA_KEY_PAIR:
        case PSA_KEY_TYPE_RSA_PUBLIC_KEY:
#if defined(MBEDTLS_PSA_CRYPTO_SE_C)
            /* TODO: reporting the public exponent for opaque keys
             * is not yet implemented.
             * https://github.com/ARMmbed/mbed-crypto/issues/216
             */
            if( psa_key_slot_is_external( slot ) )
                break;
#endif /* MBEDTLS_PSA_CRYPTO_SE_C */
            status = psa_get_rsa_public_exponent( slot->data.rsa, attributes );
            break;
#endif /* MBEDTLS_RSA_C */
        default:
            /* Nothing else to do. */
            break;
    }

    if( status != PSA_SUCCESS )
        psa_reset_key_attributes( attributes );
    return( status );
}